

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector<float,_3> res;
  float local_28 [2];
  undefined8 local_20;
  undefined4 local_18;
  float local_10 [4];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar2 = evalCtx->in[1].m_data[1];
    fVar3 = evalCtx->in[1].m_data[3];
    fVar4 = evalCtx->in[0].m_data[0];
    fVar5 = evalCtx->in[0].m_data[1];
    fVar6 = evalCtx->in[0].m_data[2];
  }
  else {
    fVar2 = -0.6;
    fVar3 = -0.1;
    fVar4 = -0.6;
    fVar5 = -0.6;
    fVar6 = -0.2;
  }
  local_28[0] = -fVar4;
  local_28[1] = -fVar5;
  local_20 = CONCAT44(local_20._4_4_,fVar6) ^ 0x80000000;
  local_10[1] = -fVar2;
  local_10[2] = -fVar3;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = local_28[lVar1] + local_10[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_20 = 0x100000000;
  local_18 = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[(int)local_28[lVar1]] = res.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}